

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

tokcxdef * tokcxini(errcxdef *errctx,mcmcxdef *mcmctx,tokldef *sctab)

{
  ushort uVar1;
  tokcxdef *__s;
  size_t sVar2;
  int *in_RDX;
  mcmcxdef *in_RSI;
  errcxdef *in_RDI;
  size_t len;
  ushort siz;
  tokscdef *sc;
  tokcxdef *ret;
  uchar index [256];
  uchar c;
  tokldef *p;
  int cnt;
  int i;
  undefined6 in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffeb8;
  tokscdef *ptVar3;
  errcxdef *in_stack_fffffffffffffec0;
  byte local_138 [271];
  byte local_29;
  int *local_28;
  int local_20;
  int local_1c;
  int *local_18;
  mcmcxdef *local_10;
  errcxdef *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_138,0,0x100);
  local_20 = 0;
  local_1c = 0;
  for (local_28 = local_18; local_29 = *(byte *)(local_28 + 1), local_29 != 0;
      local_28 = local_28 + 2) {
    if (local_138[local_29] == 0) {
      local_1c = local_1c + 1;
      local_138[local_29] = (byte)local_1c;
    }
    local_20 = local_20 + 1;
  }
  uVar1 = (short)((long)local_1c << 3) + 0x508 + ((short)local_20 + 1) * 0x18;
  __s = (tokcxdef *)
        mchalo(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
               (char *)CONCAT26(uVar1,in_stack_fffffffffffffeb0));
  memset(__s,0,(ulong)uVar1);
  memcpy(__s->tokcxinx,local_138,0x100);
  __s->tokcxerr = local_8;
  __s->tokcxmem = local_10;
  __s->tokcxifcur = 1;
  __s->tokcxptr = "";
  ptVar3 = (tokscdef *)(__s->tokcxsc + (local_1c + 1));
  for (local_28 = local_18; local_29 = *(byte *)(local_28 + 1), local_29 != 0;
      local_28 = local_28 + 2) {
    ptVar3->toksctyp = *local_28;
    sVar2 = strlen((char *)(local_28 + 1));
    ptVar3->toksclen = (int)sVar2;
    memcpy(ptVar3->tokscstr,local_28 + 1,(long)(int)sVar2);
    ptVar3->tokscnxt = __s->tokcxsc[local_138[local_29]];
    __s->tokcxsc[local_138[local_29]] = ptVar3;
    ptVar3 = ptVar3 + 1;
  }
  return __s;
}

Assistant:

tokcxdef *tokcxini(errcxdef *errctx, mcmcxdef *mcmctx, tokldef *sctab)
{
    int       i;
    int       cnt;
    tokldef  *p;
    uchar     c;
    uchar     index[256];
    tokcxdef *ret;
    tokscdef *sc;
    ushort    siz;
    
    /* set up index table: finds tokcxsc entry from character value */
    memset(index, 0, (size_t)sizeof(index));
    for (i = cnt = 0, p = sctab ; (c = p->toklstr[0]) != 0 ; ++cnt, ++p)
        if (!index[c]) index[c] = ++i;
    
    /* allocate memory for table plus the tokscdef's */
    siz = sizeof(tokcxdef) + (i * sizeof(tokscdef *))
          + ((cnt + 1) * sizeof(tokscdef));
    ret = (tokcxdef *)mchalo(errctx, siz, "tokcxini");
    memset(ret, 0, (size_t)siz);
    
    /* copy the index, set up fixed part */
    memcpy(ret->tokcxinx, index, sizeof(ret->tokcxinx));
    ret->tokcxerr = errctx;
    ret->tokcxmem = mcmctx;

    /* start out without an #if */
    ret->tokcxifcur = TOKIF_IF_YES;
    
    /* force the first toknext() to read a line */
    ret->tokcxptr = "\000";
    
    /* figure where the tokscdef's go (right after sc pointer array) */
    sc = (tokscdef *)&ret->tokcxsc[i+1];
    
    /* set up the individual tokscdef entries, and link into lists */
    for (p = sctab ; (c = p->toklstr[0]) != 0 ; ++p, ++sc)
    {
        size_t len;
        
        sc->toksctyp = p->tokltyp;
        len = sc->toksclen = strlen(p->toklstr);
        memcpy(sc->tokscstr, p->toklstr, len);
        sc->tokscnxt = ret->tokcxsc[index[c]];
        ret->tokcxsc[index[c]] = sc;
    }
    
    return(ret);
}